

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Pred5_Test::iu_SyntaxTest_x_iutest_x_Pred5_Test
          (iu_SyntaxTest_x_iutest_x_Pred5_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Pred5_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_SyntaxTest_x_iutest_x_Pred5_Test_00627da0;
  return;
}

Assistant:

IUTEST(SyntaxTest, Pred5)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED5(PredTest5, 0, x, 2, 3, 4) << x;
}